

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlExpression.h
# Opt level: O1

void __thiscall GdlExpression::SetType(GdlExpression *this,ExpressionType exptResult)

{
  if ((exptResult == kexptNumber) && (this->m_exptResult == kexptBoolean)) {
    return;
  }
  this->m_exptResult = exptResult;
  return;
}

Assistant:

virtual void SetType(ExpressionType exptResult)
	{
		if (m_exptResult == kexptBoolean && exptResult == kexptNumber)
			return;

		Assert(
			exptResult == m_exptResult ||
			m_exptResult == kexptUnknown ||
			(m_exptResult == kexptNumber &&
				exptResult == kexptBoolean));

		m_exptResult = exptResult;
	}